

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gbabios.c
# Opt level: O3

void load_alternate_bios(char *filename)

{
  uint uVar1;
  FILE *__stream;
  size_t __size;
  uint8_t *__ptr;
  
  __stream = fopen(filename,"rb");
  fseek(__stream,0,2);
  __size = ftell(__stream);
  fseek(__stream,0,0);
  __ptr = (uint8_t *)malloc(__size);
  fread(__ptr,__size,1,__stream);
  if (__size == 0x4000) {
    alternate_bios = __ptr;
    return;
  }
  load_alternate_bios_cold_1();
  uVar1 = (uint)__size & 0xff00ffff;
  if (uVar1 != 0x4000800) {
    uVar1 = (uint)__size;
  }
  if (0x4000803 < uVar1) {
    return;
  }
  return;
}

Assistant:

void load_alternate_bios(const char* filename) {
    FILE *fp = fopen(filename, "rb");

    fseek(fp, 0, SEEK_END);
    size_t size = ftell(fp);
    fseek(fp, 0, SEEK_SET);
    byte *buf = malloc(size);
    fread(buf, size, 1, fp);

    if (size != GBA_BIOS_SIZE) {
        logfatal("Incorrect bios size! Got: %zu expected: %d", size, GBA_BIOS_SIZE)
    }

    alternate_bios = buf;
}